

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,UniformBlock *blk)

{
  QDebug debug;
  long lVar1;
  Data *pDVar2;
  QDebug *pQVar3;
  QByteArray *in_RDX;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)blk);
  *(undefined1 *)&(blk->blockName).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> =
       0;
  pQVar3 = QDebug::operator<<((QDebug *)blk,"UniformBlock(");
  pQVar3 = QDebug::operator<<(pQVar3,in_RDX);
  pQVar3 = QDebug::operator<<(pQVar3,' ');
  pQVar3 = QDebug::operator<<(pQVar3,in_RDX + 1);
  pQVar3 = QDebug::operator<<(pQVar3," size=");
  QDebug::operator<<(pQVar3,*(int *)&in_RDX[2].d.d);
  if (-1 < *(int *)((long)&in_RDX[2].d.d + 4)) {
    *(undefined1 *)&(blk->blockName).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>
         = 0;
    pQVar3 = QDebug::operator<<((QDebug *)blk," binding=");
    QDebug::operator<<(pQVar3,*(int *)((long)&in_RDX[2].d.d + 4));
  }
  if (-1 < *(int *)&in_RDX[2].d.ptr) {
    *(undefined1 *)&(blk->blockName).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>
         = 0;
    pQVar3 = QDebug::operator<<((QDebug *)blk," set=");
    QDebug::operator<<(pQVar3,*(int *)&in_RDX[2].d.ptr);
  }
  *(undefined1 *)&(blk->blockName).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> =
       0;
  pQVar3 = QDebug::operator<<((QDebug *)blk,' ');
  local_48._0_8_ = pQVar3->stream;
  ((Stream *)local_48._0_8_)->ref = ((Stream *)local_48._0_8_)->ref + 1;
  debug.stream = (Stream *)(local_48 + 8);
  operator<<(debug,(QList<QShaderDescription::BlockVariable> *)local_48);
  QDebug::operator<<((QDebug *)debug.stream,')');
  QDebug::~QDebug((QDebug *)debug.stream);
  QDebug::~QDebug((QDebug *)local_48);
  pDVar2 = (blk->blockName).d.d;
  (blk->blockName).d.d = (Data *)0x0;
  *(Data **)dbg.stream = pDVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QShaderDescription::UniformBlock &blk)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "UniformBlock(" << blk.blockName << ' ' << blk.structName
                  << " size=" << blk.size;
    if (blk.binding >= 0)
        dbg.nospace() << " binding=" << blk.binding;
    if (blk.descriptorSet >= 0)
        dbg.nospace() << " set=" << blk.descriptorSet;
    dbg.nospace() << ' ' << blk.members << ')';
    return dbg;
}